

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O1

int mapIsland(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  int *piVar10;
  
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    if (0 < h) {
      uVar1 = l->startSeed;
      lVar5 = (long)w;
      piVar6 = out + lVar5 * 2 + 5;
      piVar7 = out + lVar5 + 4;
      lVar8 = 0;
      piVar10 = out;
      do {
        if (0 < w) {
          iVar2 = z + (int)lVar8;
          lVar4 = 0;
          do {
            iVar3 = piVar7[lVar4 + -1];
            piVar10[lVar4] = iVar3;
            if ((((iVar3 == 0) && (out[lVar4 + 1] == 0)) && (piVar7[lVar4] == 0)) &&
               ((piVar7[lVar4 + -2] == 0 && (piVar6[lVar4] == 0)))) {
              iVar3 = x + (int)lVar4;
              iVar9 = (int)uVar1 + iVar3;
              iVar9 = (iVar9 * 0x4c957f2d + -0x8987eb1) * iVar9 + iVar2;
              iVar3 = (iVar9 * 0x4c957f2d + -0x8987eb1) * iVar9 + iVar3;
              if (((uint)((iVar3 * 0x957f2d + 0x167814f) * iVar3 + iVar2) >> 0x18 & 1) == 0) {
                piVar10[lVar4] = 1;
              }
            }
            lVar4 = lVar4 + 1;
          } while (lVar5 != lVar4);
        }
        lVar8 = lVar8 + 1;
        piVar6 = piVar6 + lVar5 + 2;
        out = out + lVar5 + 2;
        piVar7 = piVar7 + lVar5 + 2;
        piVar10 = piVar10 + lVar5;
      } while (lVar8 != h);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapIsland(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            out[i + j*w] = v11;

            if (v11 == Oceanic)
            {
                if (out[i+1 + (j+0)*pW] != Oceanic) continue;
                if (out[i+2 + (j+1)*pW] != Oceanic) continue;
                if (out[i+0 + (j+1)*pW] != Oceanic) continue;
                if (out[i+1 + (j+2)*pW] != Oceanic) continue;

                cs = getChunkSeed(ss, i+x, j+z);
                if (mcFirstIsZero(cs, 2))
                {
                    out[i + j*w] = 1;
                }
            }
        }
    }

    return 0;
}